

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O2

EmulNet * __thiscall EmulNet::operator=(EmulNet *this,EmulNet *anotherEmulNet)

{
  int (*paiVar1) [3600];
  int (*paiVar2) [3600];
  long lVar3;
  long lVar4;
  
  this->par = anotherEmulNet->par;
  this->enInited = anotherEmulNet->enInited;
  paiVar2 = anotherEmulNet->recv_msgs;
  paiVar1 = this->recv_msgs;
  for (lVar3 = 0; lVar3 != 1000; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0xe10; lVar4 = lVar4 + 1) {
      paiVar1[-0x3e9][lVar4] = paiVar2[-0x3e9][lVar4];
      (*paiVar1)[lVar4] = (*paiVar2)[lVar4];
    }
    paiVar2 = paiVar2 + 1;
    paiVar1 = paiVar1 + 1;
  }
  EM::operator=(&this->emulnet,&anotherEmulNet->emulnet);
  return this;
}

Assistant:

EmulNet& EmulNet::operator =(EmulNet &anotherEmulNet) {
	int i, j;
	this->par = anotherEmulNet.par;
	this->enInited = anotherEmulNet.enInited;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			this->sent_msgs[i][j] = anotherEmulNet.sent_msgs[i][j];
			this->recv_msgs[i][j] = anotherEmulNet.recv_msgs[i][j];
		}
	}
	this->emulnet = anotherEmulNet.emulnet;
	return *this;
}